

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O3

SyntaxNode * slang::ast::findOverrideNodeSource(HierarchyOverrideNode *node)

{
  BindDirectiveSyntax *pBVar1;
  uint uVar2;
  type *info;
  pointer ppVar3;
  char_pointer puVar4;
  char_pointer puVar5;
  SyntaxNode *pSVar6;
  ushort uVar7;
  table_element_pointer ppVar8;
  flat_hash_map<const_syntax::SyntaxNode_*,_std::pair<ConstantValue,_const_syntax::SyntaxNode_*>_>
  *__range3;
  char_pointer puVar9;
  char_pointer puVar10;
  table_element_pointer ppVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  iterator iVar16;
  iterator iVar17;
  
  if ((node->paramOverrides).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
      .size_ctrl.size != 0) {
    iVar17 = boost::unordered::detail::foa::
             table<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
             ::begin((table<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
                      *)node);
    if (iVar17.p_ != (table_element_pointer)0x0) {
      pSVar6 = ((iVar17.p_)->second).second;
joined_r0x0016a436:
      if (pSVar6 != (SyntaxNode *)0x0) {
        return pSVar6;
      }
LAB_0016a441:
      puVar4 = iVar17.pc_;
      ppVar8 = iVar17.p_ + 1;
      if (((uint)iVar17.pc_ & 0xf) != 0xe) goto LAB_0016a489;
      auVar14[0] = -(puVar4[2] == '\0');
      auVar14[1] = -(puVar4[3] == '\0');
      auVar14[2] = -(puVar4[4] == '\0');
      auVar14[3] = -(puVar4[5] == '\0');
      auVar14[4] = -(puVar4[6] == '\0');
      auVar14[5] = -(puVar4[7] == '\0');
      auVar14[6] = -(puVar4[8] == '\0');
      auVar14[7] = -(puVar4[9] == '\0');
      auVar14[8] = -(puVar4[10] == '\0');
      auVar14[9] = -(puVar4[0xb] == '\0');
      auVar14[10] = -(puVar4[0xc] == '\0');
      auVar14[0xb] = -(puVar4[0xd] == '\0');
      auVar14[0xc] = -(puVar4[0xe] == '\0');
      auVar14[0xd] = -(puVar4[0xf] == '\0');
      auVar14[0xe] = -(puVar4[0x10] == '\0');
      auVar14[0xf] = -(puVar4[0x11] == '\0');
      uVar7 = (ushort)(SUB161(auVar14 >> 7,0) & 1) | (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe;
      if (uVar7 == 0x7fff) {
        puVar4 = puVar4 + 0x12;
        do {
          puVar5 = puVar4;
          ppVar8 = ppVar8 + 0xf;
          auVar15[0] = -(*puVar5 == '\0');
          auVar15[1] = -(puVar5[1] == '\0');
          auVar15[2] = -(puVar5[2] == '\0');
          auVar15[3] = -(puVar5[3] == '\0');
          auVar15[4] = -(puVar5[4] == '\0');
          auVar15[5] = -(puVar5[5] == '\0');
          auVar15[6] = -(puVar5[6] == '\0');
          auVar15[7] = -(puVar5[7] == '\0');
          auVar15[8] = -(puVar5[8] == '\0');
          auVar15[9] = -(puVar5[9] == '\0');
          auVar15[10] = -(puVar5[10] == '\0');
          auVar15[0xb] = -(puVar5[0xb] == '\0');
          auVar15[0xc] = -(puVar5[0xc] == '\0');
          auVar15[0xd] = -(puVar5[0xd] == '\0');
          auVar15[0xe] = -(puVar5[0xe] == '\0');
          auVar15[0xf] = -(puVar5[0xf] == '\0');
          uVar7 = (ushort)(SUB161(auVar15 >> 7,0) & 1) | (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1
                  | (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe;
          puVar4 = puVar5 + 0x10;
        } while (uVar7 == 0x7fff);
      }
      else {
        puVar5 = puVar4 + 2;
      }
      uVar2 = 0;
      if ((uVar7 ^ 0x7fff) != 0) {
        for (; ((uVar7 ^ 0x7fff) >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
        }
      }
      if (puVar5[uVar2] != '\x01') {
        puVar5 = puVar5 + uVar2;
        ppVar8 = ppVar8 + uVar2;
        goto LAB_0016a4c2;
      }
    }
  }
LAB_0016a3e8:
  for (ppVar3 = (node->binds).
                super__Vector_base<std::pair<slang::ast::BindDirectiveInfo,_const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<slang::ast::BindDirectiveInfo,_const_slang::syntax::SyntaxNode_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVar3 != (node->binds).
                super__Vector_base<std::pair<slang::ast::BindDirectiveInfo,_const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<slang::ast::BindDirectiveInfo,_const_slang::syntax::SyntaxNode_*>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; ppVar3 = ppVar3 + 1) {
    pBVar1 = (ppVar3->first).bindSyntax;
    if (pBVar1 != (BindDirectiveSyntax *)0x0) {
      return (SyntaxNode *)pBVar1;
    }
  }
  iVar16 = boost::unordered::detail::foa::
           table<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_slang::hash<slang::ast::OpaqueInstancePath::Entry,_void>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
           ::begin(&(node->childNodes).table_);
  if (iVar16.p_ == (table_element_pointer)0x0) {
    return (SyntaxNode *)0x0;
  }
  pSVar6 = findOverrideNodeSource(&(iVar16.p_)->second);
joined_r0x0016a4e9:
  if (pSVar6 != (SyntaxNode *)0x0) {
    return pSVar6;
  }
LAB_0016a4f8:
  puVar9 = iVar16.pc_;
  ppVar11 = iVar16.p_ + 1;
  if (((uint)iVar16.pc_ & 0xf) != 0xe) goto LAB_0016a540;
  auVar12[0] = -(puVar9[2] == '\0');
  auVar12[1] = -(puVar9[3] == '\0');
  auVar12[2] = -(puVar9[4] == '\0');
  auVar12[3] = -(puVar9[5] == '\0');
  auVar12[4] = -(puVar9[6] == '\0');
  auVar12[5] = -(puVar9[7] == '\0');
  auVar12[6] = -(puVar9[8] == '\0');
  auVar12[7] = -(puVar9[9] == '\0');
  auVar12[8] = -(puVar9[10] == '\0');
  auVar12[9] = -(puVar9[0xb] == '\0');
  auVar12[10] = -(puVar9[0xc] == '\0');
  auVar12[0xb] = -(puVar9[0xd] == '\0');
  auVar12[0xc] = -(puVar9[0xe] == '\0');
  auVar12[0xd] = -(puVar9[0xf] == '\0');
  auVar12[0xe] = -(puVar9[0x10] == '\0');
  auVar12[0xf] = -(puVar9[0x11] == '\0');
  uVar7 = (ushort)(SUB161(auVar12 >> 7,0) & 1) | (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1 |
          (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
          (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
          (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
          (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
          (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
          (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
          (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
          (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
          (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
          (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
          (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
          (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
          (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe;
  if (uVar7 == 0x7fff) {
    puVar9 = puVar9 + 0x12;
    do {
      puVar10 = puVar9;
      ppVar11 = ppVar11 + 0xf;
      auVar13[0] = -(*puVar10 == '\0');
      auVar13[1] = -(puVar10[1] == '\0');
      auVar13[2] = -(puVar10[2] == '\0');
      auVar13[3] = -(puVar10[3] == '\0');
      auVar13[4] = -(puVar10[4] == '\0');
      auVar13[5] = -(puVar10[5] == '\0');
      auVar13[6] = -(puVar10[6] == '\0');
      auVar13[7] = -(puVar10[7] == '\0');
      auVar13[8] = -(puVar10[8] == '\0');
      auVar13[9] = -(puVar10[9] == '\0');
      auVar13[10] = -(puVar10[10] == '\0');
      auVar13[0xb] = -(puVar10[0xb] == '\0');
      auVar13[0xc] = -(puVar10[0xc] == '\0');
      auVar13[0xd] = -(puVar10[0xd] == '\0');
      auVar13[0xe] = -(puVar10[0xe] == '\0');
      auVar13[0xf] = -(puVar10[0xf] == '\0');
      uVar7 = (ushort)(SUB161(auVar13 >> 7,0) & 1) | (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe;
      puVar9 = puVar10 + 0x10;
    } while (uVar7 == 0x7fff);
  }
  else {
    puVar10 = puVar9 + 2;
  }
  uVar2 = 0;
  if ((uVar7 ^ 0x7fff) != 0) {
    for (; ((uVar7 ^ 0x7fff) >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
    }
  }
  if (puVar10[uVar2] == '\x01') {
    return (SyntaxNode *)0x0;
  }
  puVar10 = puVar10 + uVar2;
  ppVar11 = (table_element_pointer)((long)&(ppVar11->first).value + (ulong)(uVar2 << 7));
  goto LAB_0016a577;
LAB_0016a489:
  puVar5 = puVar4 + 1;
  iVar17.p_ = ppVar8;
  iVar17.pc_ = puVar5;
  if (puVar4[1] != '\0') goto code_r0x0016a494;
  goto LAB_0016a441;
code_r0x0016a494:
  if (puVar4[1] == '\x01') goto LAB_0016a3e8;
LAB_0016a4c2:
  iVar17.p_ = ppVar8;
  iVar17.pc_ = puVar5;
  pSVar6 = (ppVar8->second).second;
  goto joined_r0x0016a436;
LAB_0016a540:
  puVar10 = puVar9 + 1;
  iVar16.p_ = ppVar11;
  iVar16.pc_ = puVar10;
  if (puVar9[1] != '\0') goto code_r0x0016a54b;
  goto LAB_0016a4f8;
code_r0x0016a54b:
  if (puVar9[1] == '\x01') {
    return (SyntaxNode *)0x0;
  }
LAB_0016a577:
  iVar16.p_ = ppVar11;
  iVar16.pc_ = puVar10;
  pSVar6 = findOverrideNodeSource(&ppVar11->second);
  goto joined_r0x0016a4e9;
}

Assistant:

static const SyntaxNode* findOverrideNodeSource(const HierarchyOverrideNode& node) {
    // Try to find some concrete syntax node (defparam or bind directive) that
    // caused us to have this override node.
    if (!node.paramOverrides.empty()) {
        for (auto& [_, val] : node.paramOverrides) {
            if (val.second)
                return val.second;
        }
    }

    for (auto& [info, _] : node.binds) {
        if (info.bindSyntax)
            return info.bindSyntax;
    }

    for (auto& [_, val] : node.childNodes) {
        if (auto result = findOverrideNodeSource(val))
            return result;
    }

    return nullptr;
}